

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_read_deviate_default
              (lys_module *module,lys_deviate *deviate,lys_node *dev_target,ly_set *dflt_check)

{
  LYS_DEVIATE_TYPE LVar1;
  LYS_NODE LVar2;
  int iVar3;
  lys_node *plVar4;
  LY_ERR *pLVar5;
  char *pcVar6;
  byte bVar7;
  ulong uVar8;
  bool bVar9;
  
  if (((module->field_0x40 & 0xc) == 0) && (dev_target->nodetype == LYS_LEAFLIST)) {
LAB_0014d23a:
    ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"default");
    pcVar6 = "Target node does not allow \"default\" property.";
    goto LAB_0014d258;
  }
  bVar7 = deviate->dflt_size;
  LVar2 = dev_target->nodetype;
  if (bVar7 < 2) {
    if ((LVar2 & (LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE)) == LYS_UNKNOWN) goto LAB_0014d23a;
  }
  else {
    bVar9 = LVar2 != LYS_LEAFLIST;
    LVar2 = LYS_LEAFLIST;
    if (bVar9) {
      ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"default");
      pcVar6 = "Target node does not allow multiple \"default\" properties.";
      goto LAB_0014d258;
    }
  }
  LVar1 = deviate->mod;
  if (LVar1 == LY_DEVIATE_RPL) {
    if ((LVar2 & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      if (LVar2 == LYS_LEAFLIST) goto LAB_0014d29c;
      if ((LVar2 != LYS_CHOICE) || (dev_target[1].dsc != (char *)0x0)) goto LAB_0014d3c6;
    }
    else if (dev_target[1].prev != (lys_node *)0x0) goto LAB_0014d28e;
    ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"default");
    pcVar6 = "Replacing a property that does not exist.";
    goto LAB_0014d258;
  }
  if (LVar1 != LY_DEVIATE_ADD) {
LAB_0014d28e:
    if (LVar1 != LY_DEVIATE_RPL || LVar2 != LYS_LEAFLIST) goto LAB_0014d3c6;
LAB_0014d29c:
    if (dev_target->padding[2] != '\0') {
      uVar8 = 0;
      do {
        lydict_remove(dev_target->module->ctx,
                      *(char **)((dev_target[1].prev)->padding + uVar8 * 8 + -0x1c));
        uVar8 = uVar8 + 1;
      } while (uVar8 < dev_target->padding[2]);
      bVar7 = deviate->dflt_size;
    }
    plVar4 = (lys_node *)realloc(dev_target[1].prev,(ulong)bVar7 << 3);
    if (plVar4 != (lys_node *)0x0) {
      dev_target[1].prev = plVar4;
      dev_target->padding[2] = '\0';
      goto LAB_0014d3c6;
    }
    goto LAB_0014d406;
  }
  if (LVar2 == LYS_CHOICE) {
    plVar4 = (lys_node *)dev_target[1].dsc;
joined_r0x0014d339:
    if (plVar4 != (lys_node *)0x0) {
      ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"default");
      pcVar6 = "Adding property that already exists.";
LAB_0014d258:
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,pcVar6);
      return 1;
    }
  }
  else if (LVar2 == LYS_LEAF) {
    plVar4 = dev_target[1].prev;
    goto joined_r0x0014d339;
  }
  if ((dev_target->flags & 0x40) != 0) {
LAB_0014d353:
    ly_vlog(LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,"default","deviation");
    pcVar6 = "nodes with the \"mandatory\"";
    if ((dev_target->flags & 0x40) == 0) {
      pcVar6 = "leaflists with non-zero \"min-elements\"";
    }
    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
            "Adding the \"default\" statement is forbidden on %s statement.",pcVar6);
    return 1;
  }
  if (LVar2 == LYS_LEAFLIST) {
    if (*(int *)&dev_target[1].priv != 0) goto LAB_0014d353;
    plVar4 = (lys_node *)
             realloc(dev_target[1].prev,(ulong)(((uint)bVar7 + (uint)dev_target->padding[2]) * 8));
    if (plVar4 == (lys_node *)0x0) {
LAB_0014d406:
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_deviate_default");
      return 1;
    }
    dev_target[1].prev = plVar4;
  }
LAB_0014d3c6:
  if (deviate->dflt_size != '\0') {
    uVar8 = 0;
    do {
      iVar3 = yang_fill_deviate_default
                        (module->ctx,deviate,dev_target,dflt_check,deviate->dflt[uVar8]);
      if (iVar3 != 0) {
        return 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < deviate->dflt_size);
  }
  return 0;
}

Assistant:

int
yang_read_deviate_default(struct lys_module *module, struct lys_deviate *deviate,
                          struct lys_node *dev_target, struct ly_set * dflt_check)
{
    int i;
    struct lys_node_leaflist *llist;
    const char **dflt;

    /* check target node type */
    if (module->version < 2 && dev_target->nodetype == LYS_LEAFLIST) {
        LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "default");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow \"default\" property.");
        goto error;
    } else if (deviate->dflt_size > 1 && dev_target->nodetype != LYS_LEAFLIST) { /* from YANG 1.1 */
        LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "default");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow multiple \"default\" properties.");
        goto error;
    } else if (!(dev_target->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_CHOICE))) {
        LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "default");
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow \"default\" property.");
        goto error;
    }

    if (deviate->mod == LY_DEVIATE_ADD) {
        /* check that there is no current value */
        if ((dev_target->nodetype == LYS_LEAF && ((struct lys_node_leaf *)dev_target)->dflt) ||
                (dev_target->nodetype == LYS_CHOICE && ((struct lys_node_choice *)dev_target)->dflt)) {
            LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "default");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Adding property that already exists.");
            goto error;
        }

        /* check collision with mandatory/min-elements */
        if ((dev_target->flags & LYS_MAND_TRUE) ||
                (dev_target->nodetype == LYS_LEAFLIST && ((struct lys_node_leaflist *)dev_target)->min)) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, "default", "deviation");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL,
                   "Adding the \"default\" statement is forbidden on %s statement.",
                   (dev_target->flags & LYS_MAND_TRUE) ? "nodes with the \"mandatory\"" : "leaflists with non-zero \"min-elements\"");
            goto error;
        }
    } else if (deviate->mod == LY_DEVIATE_RPL) {
        /* check that there was a value before */
        if (((dev_target->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && !((struct lys_node_leaf *)dev_target)->dflt) ||
                (dev_target->nodetype == LYS_CHOICE && !((struct lys_node_choice *)dev_target)->dflt)) {
            LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "default");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Replacing a property that does not exist.");
            goto error;
        }
    }

    if (dev_target->nodetype == LYS_LEAFLIST) {
        /* reallocate default list in the target */
        llist = (struct lys_node_leaflist *)dev_target;
        if (deviate->mod == LY_DEVIATE_ADD) {
            /* reallocate (enlarge) the unique array of the target */
            dflt = realloc(llist->dflt, (deviate->dflt_size + llist->dflt_size) * sizeof *dflt);
            if (!dflt) {
                LOGMEM;
                goto error;
            }
            llist->dflt = dflt;
        } else if (deviate->mod == LY_DEVIATE_RPL) {
            /* reallocate (replace) the unique array of the target */
            for (i = 0; i < llist->dflt_size; i++) {
                lydict_remove(llist->module->ctx, llist->dflt[i]);
            }
            dflt = realloc(llist->dflt, deviate->dflt_size * sizeof *dflt);
            if (!dflt) {
                LOGMEM;
                goto error;
            }
            llist->dflt = dflt;
            llist->dflt_size = 0;
        }
    }

    for (i = 0; i < deviate->dflt_size; ++i) {
        if (yang_fill_deviate_default(module->ctx, deviate, dev_target, dflt_check, deviate->dflt[i])) {
            goto error;
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}